

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.h
# Opt level: O2

int __thiscall cnn::Dim::truncate(Dim *this,char *__file,__off_t __length)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  this->bd = *(uint *)(__file + 0x20);
  uVar2 = *(undefined8 *)(__file + 8);
  uVar3 = *(undefined8 *)(__file + 0x10);
  uVar4 = *(undefined8 *)(__file + 0x18);
  *(undefined8 *)this->d = *(undefined8 *)__file;
  *(undefined8 *)(this->d + 2) = uVar2;
  *(undefined8 *)(this->d + 4) = uVar3;
  *(undefined8 *)(this->d + 6) = uVar4;
  uVar5 = size((Dim *)__file);
  uVar8 = 1;
  uVar6 = 1;
  while (uVar7 = (uint)uVar8, uVar7 < uVar5) {
    if (uVar7 < *(uint *)(__file + 0x1c)) {
      lVar1 = uVar8 * 4;
      uVar8 = (ulong)(uVar7 + 1);
      if (1 < *(uint *)(__file + lVar1)) {
        uVar6 = uVar8;
      }
    }
    else {
      uVar8 = uVar8 + 1;
    }
  }
  this->nd = (uint)uVar6;
  return (int)this;
}

Assistant:

inline Dim truncate() const {
    Dim r = *this;
    unsigned int m = 1;
    unsigned int s = size();
    for (unsigned int i = 1; i < s; ++i)
      if (size(i) > 1) m = i + 1;
    r.resize(m);
    return r;
  }